

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::CompilerGLSL::request_workaround_wrapper_overload
          (CompilerGLSL *this,TypeID id)

{
  TypedID<(diligent_spirv_cross::Types)1> *pTVar1;
  TypedID<(diligent_spirv_cross::Types)1> local_14;
  
  pTVar1 = (this->workaround_ubo_load_overload_types).
           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr;
  pTVar1 = ::std::
           __find_if<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>*,__gnu_cxx::__ops::_Iter_equals_val<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>const>>
                     (pTVar1,pTVar1 + (this->workaround_ubo_load_overload_types).
                                      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                                      .buffer_size);
  if (pTVar1 == (this->workaround_ubo_load_overload_types).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr
                + (this->workaround_ubo_load_overload_types).
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
                  buffer_size) {
    Compiler::force_recompile(&this->super_Compiler);
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_8UL>::push_back
              (&this->workaround_ubo_load_overload_types,&local_14);
  }
  return;
}

Assistant:

void CompilerGLSL::request_workaround_wrapper_overload(TypeID id)
{
	// Must be ordered to maintain deterministic output, so vector is appropriate.
	if (find(begin(workaround_ubo_load_overload_types), end(workaround_ubo_load_overload_types), id) ==
	    end(workaround_ubo_load_overload_types))
	{
		force_recompile();
		workaround_ubo_load_overload_types.push_back(id);
	}
}